

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  void *in_RDI;
  
  ~WildcardPattern((WildcardPattern *)0x18f4b8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

WildcardPattern::~WildcardPattern() {}